

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ElabSystemTaskSymbol::serializeTo(ElabSystemTaskSymbol *this,ASTSerializer *serializer)

{
  string_view sVar1;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> msg;
  
  sVar1 = ast::toString(this->taskKind);
  ASTSerializer::write(serializer,8,"taskKind",sVar1._M_len);
  getMessage(&msg,this);
  if (msg.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged == true) {
    ASTSerializer::write
              (serializer,7,"message",
               msg.
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _M_payload._M_value._M_len);
  }
  if (this->assertCondition != (Expression *)0x0) {
    ASTSerializer::write(serializer,0xf,"assertCondition",(size_t)this->assertCondition);
    return;
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("taskKind", toString(taskKind));

    if (auto msg = getMessage())
        serializer.write("message", *msg);

    if (assertCondition)
        serializer.write("assertCondition", *assertCondition);
}